

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

uint32_t __thiscall cfd::Psbt::GetTxInIndex(Psbt *this,OutPoint *outpoint)

{
  uint32_t uVar1;
  undefined **local_30;
  void *local_28;
  
  cfd::core::OutPoint::GetTxid();
  cfd::core::OutPoint::GetVout();
  uVar1 = cfd::core::Transaction::GetTxInIndex((Txid *)&this->field_0x10,(uint)&local_30);
  local_30 = &PTR__Txid_002b0f00;
  if (local_28 != (void *)0x0) {
    operator_delete(local_28);
  }
  return uVar1;
}

Assistant:

uint32_t Psbt::GetTxInIndex(const OutPoint& outpoint) const {
  return base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}